

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cc
# Opt level: O1

void __thiscall
google::protobuf::FieldDescriptor::DebugString
          (FieldDescriptor *this,int depth,PrintLabelFlag print_label_flag,string *contents,
          DebugStringOptions *debug_string_options)

{
  char *__s;
  bool bVar1;
  bool bVar2;
  FieldDescriptor *pFVar3;
  size_t sVar4;
  string label;
  string formatted_options;
  string prefix;
  string field_type;
  string local_298;
  undefined1 local_278 [48];
  SourceLocationCommentPrinter comment_printer;
  SubstituteArg local_1b0;
  SubstituteArg local_180;
  SubstituteArg local_150;
  SubstituteArg local_120;
  SubstituteArg local_f0;
  SubstituteArg local_c0;
  SubstituteArg local_90;
  SubstituteArg local_60;
  
  prefix._M_dataplus._M_p = (pointer)&prefix.field_2;
  std::__cxx11::string::_M_construct((ulong)&prefix,(char)depth * '\x02');
  field_type._M_dataplus._M_p = (pointer)&field_type.field_2;
  field_type._M_string_length = 0;
  field_type.field_2._M_local_buf[0] = '\0';
  bVar1 = is_map(this);
  if (bVar1) {
    if (*(GoogleOnceDynamic **)(this + 0x40) != (GoogleOnceDynamic *)0x0) {
      GoogleOnceDynamic::Init<google::protobuf::FieldDescriptor_const>
                (*(GoogleOnceDynamic **)(this + 0x40),TypeOnceInit,this);
    }
    FieldTypeNameDebugString_abi_cxx11_
              ((string *)local_278,*(FieldDescriptor **)(*(long *)(this + 0x70) + 0x30));
    comment_printer._0_8_ = local_278._0_8_;
    comment_printer.source_loc_.start_line = local_278._8_4_;
    if (*(GoogleOnceDynamic **)(this + 0x40) != (GoogleOnceDynamic *)0x0) {
      GoogleOnceDynamic::Init<google::protobuf::FieldDescriptor_const>
                (*(GoogleOnceDynamic **)(this + 0x40),TypeOnceInit,this);
    }
    FieldTypeNameDebugString_abi_cxx11_
              (&label,(FieldDescriptor *)(*(long *)(*(long *)(this + 0x70) + 0x30) + 0xa8));
    formatted_options._M_dataplus = label._M_dataplus;
    formatted_options._M_string_length =
         CONCAT44(formatted_options._M_string_length._4_4_,(int)label._M_string_length);
    local_f0.text_ = (char *)0x0;
    local_f0.size_ = -1;
    local_120.text_ = (char *)0x0;
    local_120.size_ = -1;
    local_150.text_ = (char *)0x0;
    local_150.size_ = -1;
    local_1b0.text_ = (char *)0x0;
    local_1b0.size_ = -1;
    local_180.text_ = (char *)0x0;
    local_180.size_ = -1;
    local_60.text_ = (char *)0x0;
    local_60.size_ = -1;
    local_90.text_ = (char *)0x0;
    local_90.size_ = -1;
    local_c0.text_ = (char *)0x0;
    local_c0.size_ = -1;
    strings::SubstituteAndAppend
              (&field_type,"map<$0, $1>",(SubstituteArg *)&comment_printer,
               (SubstituteArg *)&formatted_options,&local_f0,&local_120,&local_150,&local_1b0,
               &local_180,&local_60,&local_90,&local_c0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)label._M_dataplus._M_p != &label.field_2) {
      operator_delete(label._M_dataplus._M_p,
                      CONCAT71(label.field_2._M_allocated_capacity._1_7_,
                               label.field_2._M_local_buf[0]) + 1);
    }
    comment_printer.source_loc_._8_8_ = local_278._16_8_;
    if ((undefined1 *)local_278._0_8_ == local_278 + 0x10) goto LAB_002dd62b;
  }
  else {
    FieldTypeNameDebugString_abi_cxx11_((string *)&comment_printer,this);
    std::__cxx11::string::operator=((string *)&field_type,(string *)&comment_printer);
    local_278._0_8_ = comment_printer._0_8_;
    if ((int *)comment_printer._0_8_ == &comment_printer.source_loc_.start_column)
    goto LAB_002dd62b;
  }
  operator_delete((void *)local_278._0_8_,comment_printer.source_loc_._8_8_ + 1);
LAB_002dd62b:
  if ((*(int *)(this + 0x4c) == 1) &&
     ((print_label_flag == OMIT_LABEL || (*(int *)(*(long *)(this + 0x30) + 0x8c) == 3)))) {
    label._M_dataplus._M_p = (pointer)&label.field_2;
    label._M_string_length = 0;
    label.field_2._M_local_buf[0] = '\0';
  }
  else {
    bVar1 = is_map(this);
    label._M_dataplus._M_p = (pointer)&label.field_2;
    label._M_string_length = 0;
    label.field_2._M_local_buf[0] = '\0';
    if (!bVar1) {
      __s = *(char **)(kLabelToName + (ulong)*(uint *)(this + 0x4c) * 8);
      strlen(__s);
      std::__cxx11::string::_M_replace((ulong)&label,0,(char *)0x0,(ulong)__s);
      std::__cxx11::string::push_back((char)&label);
    }
  }
  comment_printer.source_loc_.leading_comments._M_dataplus._M_p =
       (pointer)&comment_printer.source_loc_.leading_comments.field_2;
  comment_printer.source_loc_.leading_comments._M_string_length = 0;
  comment_printer.source_loc_.leading_comments.field_2._M_local_buf[0] = '\0';
  comment_printer.source_loc_.trailing_comments._M_dataplus._M_p =
       (pointer)&comment_printer.source_loc_.trailing_comments.field_2;
  comment_printer.source_loc_.trailing_comments._M_string_length = 0;
  comment_printer.source_loc_.trailing_comments.field_2._M_local_buf[0] = '\0';
  comment_printer.source_loc_.leading_detached_comments.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  comment_printer.source_loc_.leading_detached_comments.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  comment_printer.source_loc_.leading_detached_comments.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  comment_printer.options_.include_comments = debug_string_options->include_comments;
  comment_printer.options_.elide_group_body = debug_string_options->elide_group_body;
  comment_printer.options_.elide_oneof_body = debug_string_options->elide_oneof_body;
  comment_printer.prefix_._M_dataplus._M_p = (pointer)&comment_printer.prefix_.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&comment_printer.prefix_,prefix._M_dataplus._M_p,
             prefix._M_dataplus._M_p +
             CONCAT44(prefix._M_string_length._4_4_,(undefined4)prefix._M_string_length));
  if (debug_string_options->include_comments == true) {
    bVar1 = GetSourceLocation(this,&comment_printer.source_loc_);
  }
  else {
    bVar1 = false;
  }
  comment_printer.have_source_loc_ = bVar1;
  anon_unknown_1::SourceLocationCommentPrinter::AddPreComment(&comment_printer,contents);
  formatted_options._M_dataplus = prefix._M_dataplus;
  formatted_options._M_string_length =
       CONCAT44(formatted_options._M_string_length._4_4_,(undefined4)prefix._M_string_length);
  local_f0.text_ = label._M_dataplus._M_p;
  local_f0.size_ = (int)label._M_string_length;
  local_120.text_ = field_type._M_dataplus._M_p;
  local_120.size_ = (int)field_type._M_string_length;
  if (*(GoogleOnceDynamic **)(this + 0x40) != (GoogleOnceDynamic *)0x0) {
    GoogleOnceDynamic::Init<google::protobuf::FieldDescriptor_const>
              (*(GoogleOnceDynamic **)(this + 0x40),TypeOnceInit,this);
  }
  pFVar3 = this;
  if (*(int *)(this + 0x48) == 10) {
    if (*(GoogleOnceDynamic **)(this + 0x40) != (GoogleOnceDynamic *)0x0) {
      GoogleOnceDynamic::Init<google::protobuf::FieldDescriptor_const>
                (*(GoogleOnceDynamic **)(this + 0x40),TypeOnceInit,this);
    }
    pFVar3 = *(FieldDescriptor **)(this + 0x70);
  }
  local_150.text_ = (char *)**(undefined8 **)pFVar3;
  local_150.size_ = *(int *)(*(undefined8 **)pFVar3 + 1);
  local_1b0.text_ = FastInt32ToBuffer(*(int32 *)(this + 0x38),local_1b0.scratch_);
  sVar4 = strlen(local_1b0.text_);
  local_1b0.size_ = (int)sVar4;
  local_180.text_ = (char *)0x0;
  local_180.size_ = -1;
  local_60.text_ = (char *)0x0;
  local_60.size_ = -1;
  local_90.text_ = (char *)0x0;
  local_90.size_ = -1;
  local_c0.text_ = (char *)0x0;
  local_c0.size_ = -1;
  local_278._0_8_ = (pointer)0x0;
  local_278._8_4_ = -1;
  strings::SubstituteAndAppend
            (contents,"$0$1$2 $3 = $4",(SubstituteArg *)&formatted_options,&local_f0,&local_120,
             &local_150,&local_1b0,&local_180,&local_60,&local_90,&local_c0,
             (SubstituteArg *)local_278);
  if (this[0x98] == (FieldDescriptor)0x1) {
    DefaultValueAsString_abi_cxx11_(&local_298,this,true);
    formatted_options._M_dataplus._M_p = local_298._M_dataplus._M_p;
    formatted_options._M_string_length =
         CONCAT44(formatted_options._M_string_length._4_4_,(undefined4)local_298._M_string_length);
    local_f0.text_ = (pointer)0x0;
    local_f0.size_ = -1;
    local_120.text_ = (pointer)0x0;
    local_120.size_ = -1;
    local_150.text_ = (char *)0x0;
    local_150.size_ = -1;
    local_1b0.text_ = (char *)0x0;
    local_1b0.size_ = -1;
    local_180.text_ = (char *)0x0;
    local_180.size_ = -1;
    local_60.text_ = (char *)0x0;
    local_60.size_ = -1;
    local_90.text_ = (char *)0x0;
    local_90.size_ = -1;
    local_c0.text_ = (char *)0x0;
    local_c0.size_ = -1;
    local_278._0_8_ = (pointer)0x0;
    local_278._8_4_ = -1;
    strings::SubstituteAndAppend
              (contents," [default = $0",(SubstituteArg *)&formatted_options,&local_f0,&local_120,
               &local_150,&local_1b0,&local_180,&local_60,&local_90,&local_c0,
               (SubstituteArg *)local_278);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_298._M_dataplus._M_p != &local_298.field_2) {
      operator_delete(local_298._M_dataplus._M_p,local_298.field_2._M_allocated_capacity + 1);
    }
    bVar1 = true;
  }
  else {
    bVar1 = false;
  }
  if (this[0x20] == (FieldDescriptor)0x1) {
    if (bVar1) {
      std::__cxx11::string::append((char *)contents);
    }
    else {
      bVar1 = true;
      std::__cxx11::string::append((char *)contents);
    }
    std::__cxx11::string::append((char *)contents);
    CEscape(&formatted_options,*(string **)(this + 0x28));
    std::__cxx11::string::_M_append((char *)contents,(ulong)formatted_options._M_dataplus._M_p);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)formatted_options._M_dataplus._M_p != &formatted_options.field_2) {
      operator_delete(formatted_options._M_dataplus._M_p,
                      CONCAT71(formatted_options.field_2._M_allocated_capacity._1_7_,
                               formatted_options.field_2._M_local_buf[0]) + 1);
    }
    std::__cxx11::string::append((char *)contents);
  }
  formatted_options._M_string_length = 0;
  formatted_options.field_2._M_local_buf[0] = '\0';
  formatted_options._M_dataplus._M_p = (pointer)&formatted_options.field_2;
  bVar2 = anon_unknown_1::FormatBracketedOptions
                    (depth,*(Message **)(this + 0x80),
                     *(DescriptorPool **)(*(long *)(this + 0x30) + 0x10),&formatted_options);
  if (bVar2) {
    std::__cxx11::string::append((char *)contents);
    bVar1 = true;
    std::__cxx11::string::_M_append((char *)contents,(ulong)formatted_options._M_dataplus._M_p);
  }
  if (bVar1) {
    std::__cxx11::string::append((char *)contents);
  }
  if (*(GoogleOnceDynamic **)(this + 0x40) != (GoogleOnceDynamic *)0x0) {
    GoogleOnceDynamic::Init<google::protobuf::FieldDescriptor_const>
              (*(GoogleOnceDynamic **)(this + 0x40),TypeOnceInit,this);
  }
  if ((*(int *)(this + 0x48) == 10) && (debug_string_options->elide_group_body == false)) {
    if (*(GoogleOnceDynamic **)(this + 0x40) != (GoogleOnceDynamic *)0x0) {
      GoogleOnceDynamic::Init<google::protobuf::FieldDescriptor_const>
                (*(GoogleOnceDynamic **)(this + 0x40),TypeOnceInit,this);
    }
    Descriptor::DebugString(*(Descriptor **)(this + 0x70),depth,contents,debug_string_options,false)
    ;
  }
  else {
    std::__cxx11::string::append((char *)contents);
  }
  anon_unknown_1::SourceLocationCommentPrinter::AddPostComment(&comment_printer,contents);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)formatted_options._M_dataplus._M_p != &formatted_options.field_2) {
    operator_delete(formatted_options._M_dataplus._M_p,
                    CONCAT71(formatted_options.field_2._M_allocated_capacity._1_7_,
                             formatted_options.field_2._M_local_buf[0]) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)comment_printer.prefix_._M_dataplus._M_p != &comment_printer.prefix_.field_2) {
    operator_delete(comment_printer.prefix_._M_dataplus._M_p,
                    comment_printer.prefix_.field_2._M_allocated_capacity + 1);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&comment_printer.source_loc_.leading_detached_comments);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)comment_printer.source_loc_.trailing_comments._M_dataplus._M_p !=
      &comment_printer.source_loc_.trailing_comments.field_2) {
    operator_delete(comment_printer.source_loc_.trailing_comments._M_dataplus._M_p,
                    CONCAT71(comment_printer.source_loc_.trailing_comments.field_2.
                             _M_allocated_capacity._1_7_,
                             comment_printer.source_loc_.trailing_comments.field_2._M_local_buf[0])
                    + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)comment_printer.source_loc_.leading_comments._M_dataplus._M_p !=
      &comment_printer.source_loc_.leading_comments.field_2) {
    operator_delete(comment_printer.source_loc_.leading_comments._M_dataplus._M_p,
                    CONCAT71(comment_printer.source_loc_.leading_comments.field_2.
                             _M_allocated_capacity._1_7_,
                             comment_printer.source_loc_.leading_comments.field_2._M_local_buf[0]) +
                    1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)label._M_dataplus._M_p != &label.field_2) {
    operator_delete(label._M_dataplus._M_p,
                    CONCAT71(label.field_2._M_allocated_capacity._1_7_,label.field_2._M_local_buf[0]
                            ) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)field_type._M_dataplus._M_p != &field_type.field_2) {
    operator_delete(field_type._M_dataplus._M_p,
                    CONCAT71(field_type.field_2._M_allocated_capacity._1_7_,
                             field_type.field_2._M_local_buf[0]) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)prefix._M_dataplus._M_p != &prefix.field_2) {
    operator_delete(prefix._M_dataplus._M_p,prefix.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

void FieldDescriptor::DebugString(int depth,
                                  PrintLabelFlag print_label_flag,
                                  string *contents,
                                  const DebugStringOptions&
                                  debug_string_options) const {
  string prefix(depth * 2, ' ');
  string field_type;

  // Special case map fields.
  if (is_map()) {
    strings::SubstituteAndAppend(
        &field_type, "map<$0, $1>",
        message_type()->field(0)->FieldTypeNameDebugString(),
        message_type()->field(1)->FieldTypeNameDebugString());
  } else {
    field_type = FieldTypeNameDebugString();
  }

  bool print_label = true;
  // Determine whether to omit label:
  //   1. For an optional field, omit label if it's in oneof or in proto3.
  //   2. For a repeated field, omit label if it's a map.
  if (is_optional() && (print_label_flag == OMIT_LABEL ||
                        file()->syntax() == FileDescriptor::SYNTAX_PROTO3)) {
    print_label = false;
  } else if (is_map()) {
    print_label = false;
  }
  string label;
  if (print_label) {
    label = kLabelToName[this->label()];
    label.push_back(' ');
  }

  SourceLocationCommentPrinter
      comment_printer(this, prefix, debug_string_options);
  comment_printer.AddPreComment(contents);

  strings::SubstituteAndAppend(contents, "$0$1$2 $3 = $4",
                               prefix,
                               label,
                               field_type,
                               type() == TYPE_GROUP ? message_type()->name() :
                                                      name(),
                               number());

  bool bracketed = false;
  if (has_default_value()) {
    bracketed = true;
    strings::SubstituteAndAppend(contents, " [default = $0",
                                 DefaultValueAsString(true));
  }
  if (has_json_name_) {
    if (!bracketed) {
      bracketed = true;
      contents->append("[");
    } else {
      contents->append(", ");
    }
    contents->append("json_name = \"");
    contents->append(CEscape(json_name()));
    contents->append("\"");
  }

  string formatted_options;
  if (FormatBracketedOptions(depth, options(), file()->pool(),
                             &formatted_options)) {
    contents->append(bracketed ? ", " : " [");
    bracketed = true;
    contents->append(formatted_options);
  }

  if (bracketed) {
    contents->append("]");
  }

  if (type() == TYPE_GROUP) {
    if (debug_string_options.elide_group_body) {
      contents->append(" { ... };\n");
    } else {
      message_type()->DebugString(depth, contents, debug_string_options,
                                  /* include_opening_clause */ false);
    }
  } else {
    contents->append(";\n");
  }

  comment_printer.AddPostComment(contents);
}